

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O3

void * kv_thread(void *args)

{
  fdb_status fVar1;
  int iVar2;
  int iVar3;
  filemgr_ops *pfVar4;
  ssize_t sVar5;
  undefined4 extraout_var;
  void *extraout_RAX;
  fdb_file_handle *fhandle;
  int iVar6;
  ulong uVar7;
  long lVar8;
  uint64_t num_markers;
  fdb_snapshot_info_t *markers;
  timeval __test_begin;
  ulong uStack_78;
  long lStack_70;
  void *pvStack_68;
  ulong local_30;
  fdb_snapshot_info_t *local_28;
  timeval local_20;
  
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  fhandle = *args;
  fVar1 = fdb_get_all_snap_markers(fhandle,&local_28,&local_30);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    if (local_30 == 0) {
      local_30 = 0;
    }
    else {
      uVar7 = 0;
      do {
        load_persons((storage_t *)args);
        uVar7 = uVar7 + 10;
      } while (uVar7 < local_30);
    }
    fdb_free_snap_markers(local_28,local_30);
    return (void *)0x0;
  }
  kv_thread();
  pvStack_68 = args;
  pfVar4 = get_filemgr_ops();
  iVar2 = (*pfVar4->open)((char *)fhandle,2,0x1a4);
  lVar8 = 8;
  iVar6 = 0;
  uVar7 = 0;
  iVar3 = 0;
  while( true ) {
    sVar5 = (*pfVar4->pread)(iVar2,&uStack_78,8,lVar8);
    if (sVar5 != 8) {
      corrupt_latest_superblock();
      return extraout_RAX;
    }
    if (uStack_78 == uVar7) break;
    if (uVar7 < uStack_78) {
      uVar7 = uStack_78;
      iVar3 = iVar6;
    }
    lVar8 = lVar8 + 0x1000;
    iVar6 = iVar6 + 1;
    if ((int)lVar8 == 0x4008) {
      iVar6 = rand();
      lStack_70 = (long)iVar6;
      iVar6 = rand();
      sVar5 = (*pfVar4->pwrite)(iVar2,&lStack_70,8,(ulong)(long)iVar6 % 0xff7 | (long)(iVar3 << 0xc)
                               );
      if (sVar5 != 8) {
        corrupt_latest_superblock();
      }
      iVar3 = (*pfVar4->close)(iVar2);
      return (void *)CONCAT44(extraout_var,iVar3);
    }
  }
  __assert_fail("buf != highest_rev",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                ,0x4ae,"void corrupt_latest_superblock(const char *)");
}

Assistant:

void *kv_thread(void *args) {
    // This thread stores and indexes person docs

    TEST_INIT();
    uint64_t i;
    uint64_t num_markers;
    fdb_snapshot_info_t *markers;
    fdb_status status;

    storage_t *st = (storage_t *)args;
    status = fdb_get_all_snap_markers(st->main, &markers,
                                      &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (i = 0; i < num_markers; i += 10) {
        load_persons(st);
    }
    fdb_free_snap_markers(markers, num_markers);
    return NULL;
}